

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-input.cpp
# Opt level: O1

bool Game::Input::check_input_vim(char c,intendedmove_t *intendedmove)

{
  bool bVar1;
  int iVar2;
  undefined3 in_register_00000039;
  
  iVar2 = toupper(CONCAT31(in_register_00000039,c));
  bVar1 = true;
  switch(iVar2) {
  case 0x48:
    break;
  default:
    goto switchD_0010ab6b_caseD_49;
  case 0x4a:
    intendedmove = (intendedmove_t *)(intendedmove->_M_elems + 3);
    break;
  case 0x4b:
    intendedmove = (intendedmove_t *)(intendedmove->_M_elems + 2);
    break;
  case 0x4c:
    intendedmove = (intendedmove_t *)(intendedmove->_M_elems + 1);
  }
  intendedmove->_M_elems[0] = true;
  bVar1 = false;
switchD_0010ab6b_caseD_49:
  return bVar1;
}

Assistant:

bool check_input_vim(char c, intendedmove_t &intendedmove) {
  using namespace Keypress::Code;
  switch (toupper(c)) {
  case CODE_VIM_UP:
    intendedmove[FLAG_MOVE_UP] = true;
    return false;
  case CODE_VIM_LEFT:
    intendedmove[FLAG_MOVE_LEFT] = true;
    return false;
  case CODE_VIM_DOWN:
    intendedmove[FLAG_MOVE_DOWN] = true;
    return false;
  case CODE_VIM_RIGHT:
    intendedmove[FLAG_MOVE_RIGHT] = true;
    return false;
  }
  return true;
}